

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

string * cmSystemTools::PrintSingleCommand
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *command)

{
  string_view sep;
  string_view suffix;
  string_view prefix;
  char local_1a [10];
  char *pcStack_10;
  
  if ((command->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (command->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    builtin_strncpy(local_1a,"\"\"\x01",4);
    local_1a[4] = '\0';
    local_1a[5] = '\0';
    local_1a[6] = '\0';
    local_1a[7] = '\0';
    local_1a[8] = '\0';
    local_1a[9] = '\0';
    pcStack_10 = " ";
    sep._M_str = " ";
    sep._M_len = 1;
    suffix._M_str = local_1a;
    suffix._M_len = 1;
    prefix._M_str = local_1a + 1;
    prefix._M_len = 1;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (__return_storage_ptr__,prefix,command,suffix,sep);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::PrintSingleCommand(
  std::vector<std::string> const& command)
{
  if (command.empty()) {
    return std::string();
  }

  return cmWrap('"', command, '"', " ");
}